

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

FunctionCodeGenJitTimeData *
Js::FunctionCodeGenJitTimeData::New
          (Recycler *recycler,FunctionInfo *functionInfo,EntryPointInfo *entryPoint,bool isInlined)

{
  undefined1 *puVar1;
  FunctionProxy *this;
  bool bVar2;
  uint16 profiledIterations;
  FunctionBody *this_00;
  ByteBlock *pBVar3;
  ScriptContext *pSVar4;
  Var globalThis;
  Recycler *alloc;
  FunctionCodeGenJitTimeData *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  this = (functionInfo->functionBodyImpl).ptr;
  data._32_8_ = entryPoint;
  if (this != (FunctionProxy *)0x0) {
    bVar2 = FunctionProxy::IsFunctionBody(this);
    if (bVar2) {
      this_00 = FunctionProxy::GetFunctionBody(this);
      if (this_00 != (FunctionBody *)0x0) {
        pBVar3 = FunctionBody::GetByteCode(this_00);
        if (pBVar3 == (ByteBlock *)0x0) {
          profiledIterations = 0;
          globalThis = (Var)0x0;
        }
        else {
          pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
          globalThis = GlobalObject::ToThis
                                 ((((pSVar4->super_ScriptContextBase).javascriptLibrary)->
                                  super_JavascriptLibraryBase).globalObject.ptr);
          profiledIterations = FunctionBody::GetProfiledIterations(this_00);
        }
        puVar1 = &(this_00->counters).field_0x1;
        *puVar1 = *puVar1 | 1;
        goto LAB_00413f27;
      }
    }
  }
  profiledIterations = 0;
  globalThis = (Var)0x0;
LAB_00413f27:
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_d3658c;
  data.filename._0_4_ = 0x30;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
  this_01 = (FunctionCodeGenJitTimeData *)new<Memory::Recycler>(0xb0,alloc,0x37a1d4);
  FunctionCodeGenJitTimeData
            (this_01,functionInfo,(EntryPointInfo *)data._32_8_,globalThis,profiledIterations,
             isInlined);
  return this_01;
}

Assistant:

FunctionCodeGenJitTimeData* FunctionCodeGenJitTimeData::New(Recycler* recycler, FunctionInfo *const functionInfo, EntryPointInfo *const entryPoint, bool isInlined)
    {
        Var globalThis = nullptr;
        uint16 profiledIterations = 0;
        FunctionProxy *proxy = functionInfo->GetFunctionProxy();
        if (proxy && proxy->IsFunctionBody())
        {
            FunctionBody* functionBody = proxy->GetFunctionBody();
            if (functionBody)
            {
                if (functionBody->GetByteCode())
                {
                    globalThis = functionBody->GetScriptContext()->GetLibrary()->GetGlobalObject()->ToThis();
                    profiledIterations = functionBody->GetProfiledIterations();
                }

                DebugOnly(functionBody->LockDownCounters());
            }
        }

        return RecyclerNew(recycler, FunctionCodeGenJitTimeData, functionInfo, entryPoint, globalThis, profiledIterations, isInlined);
    }